

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O3

void REV_string_response_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,attr_list attrs)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  char *pcVar3;
  
  puVar2 = (undefined8 *)CMCondition_get_client_data(cm,*data);
  if (puVar2 != (undefined8 *)0x0) {
    uVar1 = *(undefined8 *)((long)data + 8);
    *puVar2 = *data;
    puVar2[1] = uVar1;
    pcVar3 = strdup(*(char **)((long)data + 8));
    puVar2[1] = pcVar3;
  }
  CMCondition_signal(cm,*data);
  return;
}

Assistant:

static void
REV_string_response_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list attrs)
{
    EV_string_response *response = (EV_string_response*) data;
    EV_string_response *stub_ptr = CMCondition_get_client_data(cm, response->condition_var);
    if (NULL != stub_ptr) {
        memcpy(stub_ptr, data, sizeof(EV_string_response));
        stub_ptr->ret = strdup(response->ret);
    }
    CMCondition_signal(cm, response->condition_var);
}